

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

int gpioWaveGetHighPulses(void)

{
  FILE *pFVar1;
  int iVar2;
  
  pFVar1 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(pFVar1,"%s %s: \n",myTimeStamp::buf,"gpioWaveGetHighPulses");
  }
  pFVar1 = _stderr;
  iVar2 = wfStats_4;
  if ((libInitialised == '\0') && (iVar2 = -0x1f, (gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(pFVar1,"%s %s: pigpio uninitialised, call gpioInitialise()\n",myTimeStamp::buf,
            "gpioWaveGetHighPulses");
  }
  return iVar2;
}

Assistant:

int gpioWaveGetHighPulses(void)
{
   DBG(DBG_USER, "");

   CHECK_INITED;

   return wfStats.highPulses;
}